

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O1

void bloaty::macho::ParseSymbolsFromSymbolTable<nlist_64>
               (LoadCommand *cmd,SymbolTable *table,RangeSink *sink)

{
  ulong uVar1;
  bloaty *this;
  size_type __rlen;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint *puVar7;
  bool bVar8;
  string_view sVar9;
  string_view symbol;
  string_view file_range;
  string_view name_region;
  undefined1 local_90 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>
  *local_70;
  RangeSink *local_68;
  char *local_60;
  uint64_t local_58;
  char *local_50;
  ulong local_48;
  string_view local_40;
  
  if ((cmd->command_data)._M_len < 0x18) {
LAB_00196a90:
    Throw("Premature EOF reading Mach-O data.",0x36);
  }
  symbol._M_len = (cmd->command_data)._M_str;
  uVar1 = (cmd->file_data)._M_len;
  uVar6 = (ulong)*(uint *)(symbol._M_len + 8);
  uVar4 = (ulong)*(uint *)(symbol._M_len + 0xc);
  uVar5 = uVar4 * 0x10;
  if (uVar1 < uVar5 + uVar6) {
LAB_00196ab2:
    Throw("region out-of-bounds",0x5d);
  }
  uVar2 = uVar6;
  if (uVar6 <= uVar1) {
    if (uVar1 - uVar6 < uVar5) {
      uVar5 = uVar1 - uVar6;
    }
    uVar2 = (ulong)*(uint *)(symbol._M_len + 0x10);
    local_48 = (ulong)*(uint *)(symbol._M_len + 0x14);
    if (uVar1 < local_48 + uVar2) goto LAB_00196ab2;
    if (uVar2 <= uVar1) {
      if (uVar1 - uVar2 < local_48) {
        local_48 = uVar1 - uVar2;
      }
      if (*(uint *)(symbol._M_len + 0xc) != 0) {
        symbol._M_len = (cmd->file_data)._M_str;
        puVar7 = (uint *)(symbol._M_len + uVar6);
        symbol._M_len = symbol._M_len + uVar2;
        local_70 = (_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>
                    *)table;
        local_68 = sink;
        local_50 = symbol._M_len;
        do {
          bVar8 = uVar5 < 0x10;
          uVar5 = uVar5 - 0x10;
          if (bVar8) goto LAB_00196a90;
          if (((byte)puVar7[1] < 0x20) && (*(long *)(puVar7 + 2) != 0)) {
            uVar1 = (ulong)*puVar7;
            if (local_48 < uVar1) {
              Throw("region out-of-bounds",100);
            }
            local_40._M_str = symbol._M_len + uVar1;
            local_40._M_len = local_48 - uVar1;
            sVar9 = ReadUntilConsuming(&local_40,'\0');
            symbol._M_len = sVar9._M_str;
            this = (bloaty *)sVar9._M_len;
            if (6 < (int)sink->data_source_) {
              local_58 = *(uint64_t *)(puVar7 + 2);
              symbol._M_str._0_4_ = sink->data_source_;
              symbol._M_str._4_4_ = 0;
              local_60 = symbol._M_len;
              ItaniumDemangle_abi_cxx11_((string *)local_90,this,symbol,(DataSource)sVar9._M_str);
              RangeSink::AddVMRange
                        (sink,"macho_symbols",local_58,0xffffffffffffffff,(string *)local_90);
              symbol._M_len = local_60;
              table = (SymbolTable *)local_70;
              if ((bloaty *)local_90._0_8_ != (bloaty *)(local_90 + 0x10)) {
                operator_delete((void *)local_90._0_8_,local_80._M_allocated_capacity + 1);
                symbol._M_len = local_60;
                table = (SymbolTable *)local_70;
              }
            }
            if ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>
                 *)table !=
                (_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>
                 *)0x0) {
              local_80._M_allocated_capacity = *(undefined8 *)(puVar7 + 2);
              local_80._8_8_ = 0xffffffffffffffff;
              local_90._0_8_ = this;
              local_90._8_8_ = symbol._M_len;
              std::
              _Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>
              ::
              _M_emplace_unique<std::pair<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,unsigned_long>>>
                        ((_Rb_tree<std::basic_string_view<char,std::char_traits<char>>,std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>,std::_Select1st<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>
                          *)table,(pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_unsigned_long>_>
                                   *)local_90);
              sink = local_68;
            }
            sVar9._M_str = symbol._M_len;
            sVar9._M_len = (size_t)(this + 1);
            RangeSink::AddFileRangeForVMAddr
                      (sink,"macho_symtab_name",*(uint64_t *)(puVar7 + 2),sVar9);
            file_range._M_str = (char *)puVar7;
            file_range._M_len = 0x10;
            RangeSink::AddFileRangeForVMAddr
                      (sink,"macho_symtab_sym",*(uint64_t *)(puVar7 + 2),file_range);
            symbol._M_len = local_50;
          }
          puVar7 = puVar7 + 4;
          uVar3 = (int)uVar4 - 1;
          uVar4 = (ulong)uVar3;
        } while (uVar3 != 0);
      }
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",uVar2);
}

Assistant:

const T* GetStructPointer(string_view data) {
  if (sizeof(T) > data.size()) {
    THROW("Premature EOF reading Mach-O data.");
  }
  return reinterpret_cast<const T*>(data.data());
}